

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

ShaderResourceVariableDesc
Diligent::FindPipelineResourceLayoutVariable
          (PipelineResourceLayoutDesc *LayoutDesc,char *Name,SHADER_TYPE ShaderStage,
          char *CombinedSamplerSuffix)

{
  ShaderResourceVariableDesc *pSVar1;
  SHADER_TYPE SVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ShaderResourceVariableDesc SVar7;
  string msg;
  
  uVar5 = 1;
  lVar4 = 0x18;
  do {
    if ((ulong)LayoutDesc->NumVariables <= uVar5 - 1) {
      SVar2 = LayoutDesc->DefaultVariableMergeStages;
      if ((LayoutDesc->DefaultVariableMergeStages & ShaderStage) == SHADER_TYPE_UNKNOWN) {
        SVar2 = ShaderStage;
      }
      uVar5 = (ulong)CONCAT14(LayoutDesc->DefaultVariableType,SVar2);
LAB_0041834f:
      SVar7.ShaderStages = (int)uVar5;
      SVar7.Type = (char)(uVar5 >> 0x20);
      SVar7.Flags = (char)(uVar5 >> 0x28);
      SVar7._14_2_ = (short)(uVar5 >> 0x30);
      SVar7.Name = Name;
      return SVar7;
    }
    pSVar1 = LayoutDesc->Variables;
    if ((*(SHADER_TYPE *)((long)&pSVar1[-1].Name + lVar4) & ShaderStage) != SHADER_TYPE_UNKNOWN) {
      bVar3 = StreqSuff(Name,*(char **)((long)pSVar1 + lVar4 + -0x18),CombinedSamplerSuffix,false);
      if (bVar3) {
        lVar6 = lVar4;
        for (; uVar5 < LayoutDesc->NumVariables; uVar5 = uVar5 + 1) {
          if ((*(SHADER_TYPE *)((long)&LayoutDesc->Variables->Name + lVar6) & ShaderStage) !=
              SHADER_TYPE_UNKNOWN) {
            bVar3 = StreqSuff(Name,*(char **)((long)LayoutDesc->Variables + lVar6 + -8),
                              CombinedSamplerSuffix,false);
            if (bVar3) {
              FormatString<char[149]>
                        (&msg,(char (*) [149])
                              "There must be no variables with overlapping stages in Desc.ResourceLayout. This error should\'ve been caught by ValidatePipelineResourceLayoutDesc()."
                        );
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"FindPipelineResourceLayoutVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                         ,0x39c);
              std::__cxx11::string::~string((string *)&msg);
            }
          }
          lVar6 = lVar6 + 0x10;
        }
        Name = *(char **)((long)pSVar1 + lVar4 + -0x18);
        uVar5 = *(ulong *)((long)&pSVar1[-1].Name + lVar4);
        goto LAB_0041834f;
      }
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

ShaderResourceVariableDesc FindPipelineResourceLayoutVariable(
    const PipelineResourceLayoutDesc& LayoutDesc,
    const char*                       Name,
    SHADER_TYPE                       ShaderStage,
    const char*                       CombinedSamplerSuffix)
{
    for (Uint32 i = 0; i < LayoutDesc.NumVariables; ++i)
    {
        const ShaderResourceVariableDesc& Var = LayoutDesc.Variables[i];
        if ((Var.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var.Name, CombinedSamplerSuffix))
        {
#ifdef DILIGENT_DEBUG
            for (Uint32 j = i + 1; j < LayoutDesc.NumVariables; ++j)
            {
                const ShaderResourceVariableDesc& Var2 = LayoutDesc.Variables[j];
                VERIFY(!((Var2.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var2.Name, CombinedSamplerSuffix)),
                       "There must be no variables with overlapping stages in Desc.ResourceLayout. "
                       "This error should've been caught by ValidatePipelineResourceLayoutDesc().");
            }
#endif
            return Var;
        }
    }

    // Use default properties
    if (ShaderStage & LayoutDesc.DefaultVariableMergeStages)
        ShaderStage = LayoutDesc.DefaultVariableMergeStages;
    return {ShaderStage, Name, LayoutDesc.DefaultVariableType};
}